

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleLineDirective(Preprocessor *this,Token directive)

{
  SourceManager *this_00;
  optional<unsigned_char> oVar1;
  LineDirectiveSyntax *syntax;
  SourceLocation location;
  optional<unsigned_long> oVar2;
  string_view name;
  SourceRange range;
  Token level;
  Token fileName;
  Token lineNumber;
  void *local_90;
  uint local_88;
  byte local_83;
  Token local_80;
  Token local_70;
  Token local_60;
  Token local_50;
  Trivia local_40;
  
  local_50.info = directive.info;
  local_50._0_8_ = directive._0_8_;
  local_60 = expect(this,IntegerLiteral);
  local_70 = expect(this,StringLiteral);
  local_80 = expect(this,IntegerLiteral);
  syntax = BumpAllocator::
           emplace<slang::syntax::LineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_50,&local_60,&local_70,&local_80);
  if (((((undefined1  [16])local_60 & (undefined1  [16])0x10000) == (undefined1  [16])0x0) &&
      (((undefined1  [16])local_70 & (undefined1  [16])0x10000) == (undefined1  [16])0x0)) &&
     (((undefined1  [16])local_80 & (undefined1  [16])0x10000) == (undefined1  [16])0x0)) {
    Token::intValue((Token *)&local_90);
    oVar1 = SVInt::as<unsigned_char>((SVInt *)&local_90);
    if (((0x40 < local_88) || ((local_83 & 1) != 0)) && (local_90 != (void *)0x0)) {
      operator_delete__(local_90);
    }
    Token::intValue((Token *)&local_90);
    oVar2 = SVInt::as<unsigned_long>((SVInt *)&local_90);
    if (((0x40 < local_88) || ((local_83 & 1) != 0)) && (local_90 != (void *)0x0)) {
      operator_delete__(local_90);
    }
    if ((oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_char>._M_engaged &
        oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_char>._M_payload < 3) == 0) {
      range = Token::range(&local_80);
      Diagnostics::add(this->diagnostics,(DiagCode)0xc0004,range);
    }
    else if (((undefined1  [16])
              oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) {
      this_00 = this->sourceManager;
      location = Token::location(&local_50);
      name = Token::valueText(&local_70);
      SourceManager::addLineDirective
                (this_00,location,
                 oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload,name,
                 oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_char>._M_payload);
    }
  }
  Trivia::Trivia(&local_40,Directive,(SyntaxNode *)syntax);
  return local_40;
}

Assistant:

Trivia Preprocessor::handleLineDirective(Token directive) {
    Token lineNumber = expect(TokenKind::IntegerLiteral);
    Token fileName = expect(TokenKind::StringLiteral);
    Token level = expect(TokenKind::IntegerLiteral);

    auto result = alloc.emplace<LineDirectiveSyntax>(directive, lineNumber, fileName, level);

    if (!lineNumber.isMissing() && !fileName.isMissing() && !level.isMissing()) {
        auto levNum = level.intValue().as<uint8_t>();
        auto lineNum = lineNumber.intValue().as<size_t>();

        if (!levNum.has_value() || (*levNum != 0 && *levNum != 1 && *levNum != 2)) {
            // We don't actually use the level for anything, but the spec allows
            // only the values 0,1,2
            addDiag(diag::InvalidLineDirectiveLevel, level.range());
        }
        else if (lineNum) {
            // We should only notify the source manager about the line directive if it
            // is well formed, to avoid very strange line number issues.
            sourceManager.addLineDirective(directive.location(), *lineNum, fileName.valueText(),
                                           *levNum);
        }
    }
    return Trivia(TriviaKind::Directive, result);
}